

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_expr(runtime_type *this,iterator *it,bool disable_parallel)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  signal_types sVar4;
  undefined8 uVar5;
  token_base **pptVar6;
  iterator iVar7;
  string *str;
  byte in_CL;
  runtime_type *in_RDX;
  proxy *in_RDI;
  tree_type<cs::token_base_*> *tree_1;
  iterator __end3_1;
  iterator __begin3_1;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range3_1;
  any *it_1;
  const_iterator __end5;
  const_iterator __begin5;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *__range5;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *child_arr;
  var val;
  tree_type<cs::token_base_*> *tree;
  iterator __end3;
  iterator __begin3;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range3;
  token_base *ptr_1;
  array arr;
  token_literal *ptr;
  token_base *token;
  var *result;
  _Self *in_stack_fffffffffffff698;
  internal_error *in_stack_fffffffffffff6a0;
  internal_error *this_00;
  runtime_type *in_stack_fffffffffffff6a8;
  var *in_stack_fffffffffffff6b0;
  runtime_type *in_stack_fffffffffffff6b8;
  var *in_stack_fffffffffffff6c8;
  var *in_stack_fffffffffffff6d0;
  runtime_type *in_stack_fffffffffffff6d8;
  var *in_stack_fffffffffffff6e0;
  runtime_type *in_stack_fffffffffffff6e8;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_fffffffffffff6f0;
  runtime_type *in_stack_fffffffffffff6f8;
  var *in_stack_fffffffffffff700;
  runtime_type *in_stack_fffffffffffff708;
  var *in_stack_fffffffffffff710;
  runtime_type *in_stack_fffffffffffff718;
  var_id *in_stack_fffffffffffff720;
  runtime_type *in_stack_fffffffffffff728;
  var *in_stack_fffffffffffff730;
  runtime_type *in_stack_fffffffffffff738;
  var *in_stack_fffffffffffff748;
  var *in_stack_fffffffffffff750;
  runtime_type *in_stack_fffffffffffff758;
  var *in_stack_fffffffffffff760;
  runtime_type *in_stack_fffffffffffff768;
  var *in_stack_fffffffffffff770;
  runtime_type *in_stack_fffffffffffff778;
  string *in_stack_fffffffffffff780;
  runtime_type *in_stack_fffffffffffff788;
  var *in_stack_fffffffffffff798;
  token_base *in_stack_fffffffffffff7a0;
  runtime_type *in_stack_fffffffffffff7a8;
  var *in_stack_fffffffffffff7b8;
  runtime_type *in_stack_fffffffffffff7c0;
  iterator in_stack_fffffffffffff7c8;
  undefined1 local_759 [33];
  tree_node *local_738;
  var *in_stack_fffffffffffff8e0;
  runtime_type *in_stack_fffffffffffff8e8;
  token_base *in_stack_fffffffffffff908;
  var *in_stack_fffffffffffff910;
  runtime_type *in_stack_fffffffffffff918;
  token_base *in_stack_fffffffffffff9d8;
  var *in_stack_fffffffffffff9e0;
  runtime_type *in_stack_fffffffffffff9e8;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_258;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_238;
  undefined1 local_22b;
  undefined1 local_22a;
  allocator local_229;
  string local_228 [40];
  tree_node *local_200;
  EVP_PKEY_CTX local_1f8 [8];
  EVP_PKEY_CTX local_1f0 [8];
  EVP_PKEY_CTX local_1e8 [8];
  EVP_PKEY_CTX local_1e0 [8];
  reference local_1d8;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> local_1b0;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_190;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_188;
  tree_node *local_180;
  tree_node *local_170;
  reference local_168;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_140;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_120;
  token_expand *local_118;
  tree_node *local_c0;
  token_array *local_b8;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [38];
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  token_array *local_60;
  undefined1 local_55;
  allocator local_41;
  string local_40 [31];
  undefined1 in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  bVar2 = tree_type<cs::token_base_*>::iterator::usable((iterator *)in_RDX);
  if (!bVar2) {
    local_55 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"The expression tree is not available.",&local_41);
    internal_error::internal_error(in_stack_fffffffffffff6a0,(string *)in_stack_fffffffffffff698);
    local_55 = 0;
    __cxa_throw(uVar5,&internal_error::typeinfo,internal_error::~internal_error);
  }
  pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)in_stack_fffffffffffff6e0);
  local_60 = (token_array *)*pptVar6;
  if (local_60 == (token_array *)0x0) {
    memset(in_RDI,0,8);
    cs_impl::any::any((any *)in_RDI);
  }
  else {
    iVar3 = (*(local_60->super_token_base)._vptr_token_base[2])();
    switch(iVar3) {
    case 3:
      sVar4 = token_signal::get_signal((token_signal *)local_60);
      switch(sVar4) {
      case add_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_add(in_stack_fffffffffffff778,in_stack_fffffffffffff770,
                  (var *)in_stack_fffffffffffff768);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x5195f7);
        cs_impl::any::~any((any *)0x519604);
        cs_impl::any::~any((any *)0x519611);
        break;
      case addasi_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_addasi(in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
        cs_impl::any::~any((any *)0x519732);
        cs_impl::any::~any((any *)0x51973f);
        break;
      case sub_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_sub(in_stack_fffffffffffff728,(var *)in_stack_fffffffffffff720,
                  (var *)in_stack_fffffffffffff718);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x519854);
        cs_impl::any::~any((any *)0x519861);
        cs_impl::any::~any((any *)0x51986e);
        break;
      case subasi_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_subasi(in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
        cs_impl::any::~any((any *)0x51998f);
        cs_impl::any::~any((any *)0x51999c);
        break;
      case mul_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_mul(in_stack_fffffffffffff728,(var *)in_stack_fffffffffffff720,
                  (var *)in_stack_fffffffffffff718);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x519b8b);
        cs_impl::any::~any((any *)0x519b98);
        cs_impl::any::~any((any *)0x519ba5);
        break;
      case mulasi_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_mulasi(in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
        cs_impl::any::~any((any *)0x519cc6);
        cs_impl::any::~any((any *)0x519cd3);
        break;
      case div_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_div(in_stack_fffffffffffff728,(var *)in_stack_fffffffffffff720,
                  (var *)in_stack_fffffffffffff718);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x519e7b);
        cs_impl::any::~any((any *)0x519e88);
        cs_impl::any::~any((any *)0x519e95);
        break;
      case divasi_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_divasi(in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
        cs_impl::any::~any((any *)0x519fb6);
        cs_impl::any::~any((any *)0x519fc3);
        break;
      case mod_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_mod(in_stack_fffffffffffff768,in_stack_fffffffffffff760,
                  (var *)in_stack_fffffffffffff758);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x51a0d8);
        cs_impl::any::~any((any *)0x51a0e5);
        cs_impl::any::~any((any *)0x51a0f2);
        break;
      case modasi_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_modasi(in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
        cs_impl::any::~any((any *)0x51a213);
        cs_impl::any::~any((any *)0x51a220);
        break;
      case pow_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_pow(in_stack_fffffffffffff768,in_stack_fffffffffffff760,
                  (var *)in_stack_fffffffffffff758);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x51a335);
        cs_impl::any::~any((any *)0x51a342);
        cs_impl::any::~any((any *)0x51a34f);
        break;
      case powasi_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_powasi(in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8);
        cs_impl::any::~any((any *)0x51a470);
        cs_impl::any::~any((any *)0x51a47d);
        break;
      default:
        goto LAB_0051bc1f;
      case dot_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        tree_type<cs::token_base_*>::iterator::data((iterator *)in_stack_fffffffffffff6e0);
        parse_dot(in_stack_fffffffffffff918,in_stack_fffffffffffff910,in_stack_fffffffffffff908);
        cs_impl::any::~any((any *)0x51a574);
        break;
      case und_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_und(in_stack_fffffffffffff718,in_stack_fffffffffffff710,
                  (var *)in_stack_fffffffffffff708);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x51a9c8);
        cs_impl::any::~any((any *)0x51a9d5);
        cs_impl::any::~any((any *)0x51a9e2);
        break;
      case abo_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_abo(in_stack_fffffffffffff718,in_stack_fffffffffffff710,
                  (var *)in_stack_fffffffffffff708);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x51ab1a);
        cs_impl::any::~any((any *)0x51ab27);
        cs_impl::any::~any((any *)0x51ab34);
        break;
      case asi_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_asi(in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
                  (var *)in_stack_fffffffffffff6d8);
        cs_impl::any::~any((any *)0x51ac55);
        cs_impl::any::~any((any *)0x51ac62);
        break;
      case lnkasi_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_lnkasi(in_stack_fffffffffffff7c0,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7b8);
        cs_impl::any::~any((any *)0x51ad35);
        break;
      case equ_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_equ(in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,
                  (var *)in_stack_fffffffffffff6a8);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x51b0ef);
        cs_impl::any::~any((any *)0x51b0fc);
        cs_impl::any::~any((any *)0x51b109);
        break;
      case ueq_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_ueq(in_stack_fffffffffffff718,in_stack_fffffffffffff710,
                  (var *)in_stack_fffffffffffff708);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x51b23b);
        cs_impl::any::~any((any *)0x51b248);
        cs_impl::any::~any((any *)0x51b255);
        break;
      case aeq_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_aeq(in_stack_fffffffffffff718,in_stack_fffffffffffff710,
                  (var *)in_stack_fffffffffffff708);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x51b387);
        cs_impl::any::~any((any *)0x51b394);
        cs_impl::any::~any((any *)0x51b3a1);
        break;
      case neq_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_neq(in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,
                  (var *)in_stack_fffffffffffff6a8);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x51b4d3);
        cs_impl::any::~any((any *)0x51b4e0);
        cs_impl::any::~any((any *)0x51b4ed);
        break;
      case and_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_and(in_stack_fffffffffffff708,(iterator *)in_stack_fffffffffffff700,
                  (iterator *)in_stack_fffffffffffff6f8);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x51b5d3);
        break;
      case or_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_or(in_stack_fffffffffffff708,(iterator *)in_stack_fffffffffffff700,
                 (iterator *)in_stack_fffffffffffff6f8);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x51b673);
        break;
      case not_:
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_not(in_stack_fffffffffffff6f8,(var *)in_stack_fffffffffffff6f0);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x51b717);
        cs_impl::any::~any((any *)0x51b724);
        break;
      case inc_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_inc(in_stack_fffffffffffff758,in_stack_fffffffffffff750,in_stack_fffffffffffff748);
        cs_impl::any::~any((any *)0x51b81c);
        cs_impl::any::~any((any *)0x51b829);
        break;
      case dec_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_dec(in_stack_fffffffffffff758,in_stack_fffffffffffff750,in_stack_fffffffffffff748);
        cs_impl::any::~any((any *)0x51b921);
        cs_impl::any::~any((any *)0x51b92e);
        break;
      case pair_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_pair(in_stack_fffffffffffff728,(var *)in_stack_fffffffffffff720,
                   (var *)in_stack_fffffffffffff718);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x51afa3);
        cs_impl::any::~any((any *)0x51afb0);
        cs_impl::any::~any((any *)0x51afbd);
        break;
      case choice_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        iVar7 = tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_choice((runtime_type *)iVar7.mData,in_stack_fffffffffffff710,
                     (iterator *)in_stack_fffffffffffff708);
        cs_impl::any::~any((any *)0x51aeb7);
        break;
      case fcall_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        tree_type<cs::token_base_*>::iterator::data((iterator *)in_stack_fffffffffffff6e0);
        parse_fcall(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
        cs_impl::any::~any((any *)0x51baed);
        break;
      case access_:
        iVar7 = tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        local_738 = (tree_node *)
                    tree_type<cs::token_base_*>::iterator::right
                              ((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_access(in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,(var *)iVar7.mData);
        cs_impl::any::~any((any *)0x51bbc2);
        cs_impl::any::~any((any *)0x51bbcf);
        break;
      case typeid_:
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_typeid(in_stack_fffffffffffff6a8,(var *)in_stack_fffffffffffff6a0);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x51a6f2);
        cs_impl::any::~any((any *)0x51a6ff);
        break;
      case addr_:
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_addr(in_stack_fffffffffffff6a8,(var *)in_stack_fffffffffffff6a0);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x51b9f5);
        cs_impl::any::~any((any *)0x51ba02);
        break;
      case new_:
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_new(in_stack_fffffffffffff6f8,(var *)in_stack_fffffffffffff6f0);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x51a7cc);
        cs_impl::any::~any((any *)0x51a7d9);
        break;
      case gcnew_:
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_gcnew(in_stack_fffffffffffff708,in_stack_fffffffffffff700);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x51a8a6);
        cs_impl::any::~any((any *)0x51a8b3);
        break;
      case arrow_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        tree_type<cs::token_base_*>::iterator::data((iterator *)in_stack_fffffffffffff6e0);
        parse_arrow(in_stack_fffffffffffff708,in_stack_fffffffffffff700,
                    (token_base *)in_stack_fffffffffffff6f8);
        cs_impl::any::~any((any *)0x51a648);
        break;
      case escape_:
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_escape(in_stack_fffffffffffff738,in_stack_fffffffffffff730);
        cs_impl::any::~any((any *)0x519d89);
        break;
      case minus_:
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_minus(in_stack_fffffffffffff718,in_stack_fffffffffffff710);
        rvalue((var *)in_stack_fffffffffffff6a8);
        cs_impl::any::~any((any *)0x519a69);
        cs_impl::any::~any((any *)0x519a76);
        break;
      case bind_:
        tree_type<cs::token_base_*>::iterator::left((iterator *)in_stack_fffffffffffff6e8);
        tree_type<cs::token_base_*>::iterator::data((iterator *)in_stack_fffffffffffff6e0);
        tree_type<cs::token_base_*>::iterator::right((iterator *)in_stack_fffffffffffff6e8);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        parse_bind(in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
        cs_impl::any::~any((any *)0x51adfd);
      }
      break;
    case 4:
      token_id::get_id((token_id *)local_60);
      domain_manager::get_var((domain_manager *)in_stack_fffffffffffff728,in_stack_fffffffffffff720)
      ;
      cs_impl::any::any((any *)in_stack_fffffffffffff6a0,(any *)in_stack_fffffffffffff698);
      break;
    case 5:
      local_82 = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_80,"Wrong declaration of variable argument list.",&local_81);
      runtime_error::runtime_error
                ((runtime_error *)in_stack_fffffffffffff6a0,(string *)in_stack_fffffffffffff698);
      local_82 = 0;
      __cxa_throw(uVar5,&runtime_error::typeinfo,runtime_error::~runtime_error);
    case 6:
      local_aa = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"Wrong expanding position.",&local_a9);
      runtime_error::runtime_error
                ((runtime_error *)in_stack_fffffffffffff6a0,(string *)in_stack_fffffffffffff698);
      local_aa = 0;
      __cxa_throw(uVar5,&runtime_error::typeinfo,runtime_error::~runtime_error);
    case 7:
      token_value::get_value((token_value *)local_60);
      cs_impl::any::any((any *)in_stack_fffffffffffff6a0,(any *)in_stack_fffffffffffff698);
      break;
    case 8:
      local_b8 = local_60;
      token_literal::get_data_abi_cxx11_((token_literal *)local_60);
      token_literal::get_literal_abi_cxx11_((token_literal *)local_b8);
      get_string_literal(in_stack_fffffffffffff788,in_stack_fffffffffffff780,
                         (string *)in_stack_fffffffffffff778);
      break;
    default:
LAB_0051bc1f:
      str = (string *)__cxa_allocate_exception(0x28);
      this_00 = (internal_error *)local_759;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_759 + 1),"Unrecognized expression.",(allocator *)this_00);
      internal_error::internal_error(this_00,str);
      __cxa_throw(str,&internal_error::typeinfo,internal_error::~internal_error);
    case 0xc:
      token_expr::get_tree((token_expr *)local_60);
      local_c0 = (tree_node *)
                 tree_type<cs::token_base_*>::root
                           ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff698);
      parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                 (bool)in_stack_ffffffffffffffdf);
      break;
    case 0xe:
      std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::deque
                ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x518e5c);
      local_118 = (token_expand *)0x0;
      local_120 = token_array::get_array(local_60);
      std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
      ::begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
               *)in_stack_fffffffffffff698);
      std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
      ::end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             *)in_stack_fffffffffffff698);
      while (bVar2 = std::operator!=((_Self *)in_stack_fffffffffffff6a0,
                                     (_Self *)in_stack_fffffffffffff698), bVar2) {
        local_168 = std::
                    _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                    ::operator*(&local_140);
        local_170 = (tree_node *)
                    tree_type<cs::token_base_*>::root
                              ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff698);
        pptVar6 = tree_type<cs::token_base_*>::iterator::data((iterator *)in_stack_fffffffffffff6e0)
        ;
        local_118 = (token_expand *)*pptVar6;
        if ((local_118 == (token_expand *)0x0) ||
           (iVar3 = (*(local_118->super_token_base)._vptr_token_base[2])(), iVar3 != 6)) {
          local_200 = (tree_node *)
                      tree_type<cs::token_base_*>::root
                                ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff698);
          parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                     (bool)in_stack_ffffffffffffffdf);
          copy(local_1f0,local_1f8);
          std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back
                    ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffff6a0
                     ,(value_type *)in_stack_fffffffffffff698);
          cs_impl::any::~any((any *)0x5191c2);
          cs_impl::any::~any((any *)0x5191cf);
        }
        else {
          token_expand::get_tree(local_118);
          local_180 = (tree_node *)
                      tree_type<cs::token_base_*>::root
                                ((tree_type<cs::token_base_*> *)in_stack_fffffffffffff698);
          parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                     (bool)in_stack_ffffffffffffffdf);
          local_190 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                                ((any *)in_stack_fffffffffffff720);
          local_188 = local_190;
          std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::begin
                    ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffff698
                    );
          std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::end
                    ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffff698
                    );
          while (bVar2 = std::operator!=((_Self *)in_stack_fffffffffffff6a0,
                                         in_stack_fffffffffffff698), bVar2) {
            local_1d8 = std::
                        _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>::
                        operator*(&local_1b0);
            cs_impl::any::any((any *)in_stack_fffffffffffff6a0,(any *)in_stack_fffffffffffff698);
            copy(local_1e0,local_1e8);
            std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::push_back
                      ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                       in_stack_fffffffffffff6a0,(value_type *)in_stack_fffffffffffff698);
            cs_impl::any::~any((any *)0x519087);
            cs_impl::any::~any((any *)0x519094);
            std::_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>::
            operator++((_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> *)
                       in_stack_fffffffffffff6a0);
          }
          cs_impl::any::~any((any *)0x519128);
        }
        std::
        _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
        ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                      *)in_stack_fffffffffffff6a0);
      }
      cs_impl::any::
      make<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffff6b8);
      rvalue((var *)in_stack_fffffffffffff6a8);
      cs_impl::any::~any((any *)0x519269);
      std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque(in_stack_fffffffffffff6f0);
      break;
    case 0xf:
      if ((bVar1 & 1) != 0) {
        local_22a = 1;
        uVar5 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_228,"Do not allowed parallel list.",&local_229);
        runtime_error::runtime_error
                  ((runtime_error *)in_stack_fffffffffffff6a0,(string *)in_stack_fffffffffffff698);
        local_22a = 0;
        __cxa_throw(uVar5,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      local_22b = 0;
      cs_impl::any::any((any *)in_RDI);
      local_238 = token_parallel::get_parallel((token_parallel *)local_60);
      std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
      ::begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
               *)in_stack_fffffffffffff698);
      std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
      ::end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             *)in_stack_fffffffffffff698);
      while (bVar2 = std::operator!=((_Self *)in_stack_fffffffffffff6a0,
                                     (_Self *)in_stack_fffffffffffff698), bVar2) {
        std::
        _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
        ::operator*(&local_258);
        tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffff698);
        parse_expr(in_RDX,(iterator *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                   (bool)in_stack_ffffffffffffffdf);
        cs_impl::any::operator=((any *)in_stack_fffffffffffff6a0,(any *)in_stack_fffffffffffff698);
        cs_impl::any::~any((any *)0x519499);
        std::
        _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
        ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                      *)in_stack_fffffffffffff6a0);
      }
    }
  }
  return (var)in_RDI;
}

Assistant:

var runtime_type::parse_expr(const tree_type<token_base *>::iterator &it, bool disable_parallel)
	{
		if (!it.usable())
			throw internal_error("The expression tree is not available.");
		token_base *token = it.data();
		if (token == nullptr)
			return var();
		switch (token->get_type()) {
		default:
			break;
		case token_types::vargs:
			throw runtime_error("Wrong declaration of variable argument list.");
			break;
		case token_types::expand:
			throw runtime_error("Wrong expanding position.");
			break;
		case token_types::id:
			return storage.get_var(static_cast<token_id *>(token)->get_id());
			break;
		case token_types::literal: {
			token_literal *ptr = static_cast<token_literal *>(token);
			return get_string_literal(ptr->get_data(), ptr->get_literal());
		}
		case token_types::value:
			return static_cast<token_value *>(token)->get_value();
			break;
		case token_types::expr:
			return parse_expr(static_cast<token_expr *>(token)->get_tree().root());
			break;
		case token_types::array: {
			array arr;
			token_base *ptr = nullptr;
			for (auto &tree: static_cast<token_array *>(token)->get_array()) {
				ptr = tree.root().data();
				if (ptr != nullptr && ptr->get_type() == token_types::expand) {
					var val = parse_expr(static_cast<token_expand *>(ptr)->get_tree().root());
					const auto &child_arr = val.const_val<array>();
					for (auto &it: child_arr)
						arr.push_back(copy(it));
				}
				else
					arr.push_back(copy(parse_expr(tree.root())));
			}
			return rvalue(var::make<array>(std::move(arr)));
		}
		case token_types::parallel: {
			if (disable_parallel)
				throw runtime_error("Do not allowed parallel list.");
			var result;
			for (auto &tree: static_cast<token_parallel *>(token)->get_parallel())
				result = parse_expr(tree.root());
			return result;
		}
		case token_types::signal: {
			switch (static_cast<token_signal *>(token)->get_signal()) {
			default:
				break;
			case signal_types::add_:
				return rvalue(parse_add(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::addasi_:
				return parse_addasi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::sub_:
				return rvalue(parse_sub(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::subasi_:
				return parse_subasi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::minus_:
				return rvalue(parse_minus(parse_expr(it.right())));
				break;
			case signal_types::mul_:
				return rvalue(parse_mul(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::mulasi_:
				return parse_mulasi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::escape_:
				return parse_escape(parse_expr(it.right()));
				break;
			case signal_types::div_:
				return rvalue(parse_div(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::divasi_:
				return parse_divasi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::mod_:
				return rvalue(parse_mod(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::modasi_:
				return parse_modasi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::pow_:
				return rvalue(parse_pow(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::powasi_:
				return parse_powasi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::dot_:
				return parse_dot(parse_expr(it.left()), it.right().data());
				break;
			case signal_types::arrow_:
				return parse_arrow(parse_expr(it.left()), it.right().data());
				break;
			case signal_types::typeid_:
				return rvalue(parse_typeid(parse_expr(it.right())));
				break;
			case signal_types::new_:
				return rvalue(parse_new(parse_expr(it.right())));
				break;
			case signal_types::gcnew_:
				return rvalue(parse_gcnew(parse_expr(it.right())));
				break;
			case signal_types::und_:
				return rvalue(parse_und(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::abo_:
				return rvalue(parse_abo(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::asi_:
				return parse_asi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::lnkasi_:
				return parse_lnkasi(it.left(), parse_expr(it.right()));
				break;
			case signal_types::bind_:
				return parse_bind(it.left().data(), parse_expr(it.right()));
				break;
			case signal_types::choice_:
				return parse_choice(parse_expr(it.left()), it.right());
				break;
			case signal_types::pair_:
				return rvalue(parse_pair(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::equ_:
				return rvalue(parse_equ(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::ueq_:
				return rvalue(parse_ueq(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::aeq_:
				return rvalue(parse_aeq(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::neq_:
				return rvalue(parse_neq(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::and_:
				return rvalue(parse_and(it.left(), it.right()));
				break;
			case signal_types::or_:
				return rvalue(parse_or(it.left(), it.right()));
				break;
			case signal_types::not_:
				return rvalue(parse_not(parse_expr(it.right())));
				break;
			case signal_types::inc_:
				return parse_inc(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::dec_:
				return parse_dec(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::addr_:
				return rvalue(parse_addr(parse_expr(it.right())));
				break;
			case signal_types::fcall_:
				return parse_fcall(parse_expr(it.left()), it.right().data());
				break;
			case signal_types::access_:
				return parse_access(parse_expr(it.left()), parse_expr(it.right()));
				break;
			}
		}
		}
		throw internal_error("Unrecognized expression.");
	}